

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O3

double LZ77OptimalRun(ZopfliBlockState *s,uchar *in,size_t instart,size_t inend,
                     unsigned_short **path,size_t *pathsize,unsigned_short *length_array,
                     CostModelFun *costmodel,void *costcontext,ZopfliLZ77Store *store,ZopfliHash *h,
                     float *costs)

{
  ushort uVar1;
  unsigned_short uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  uchar *puVar5;
  unsigned_short **ppuVar6;
  ulong *puVar7;
  float *pfVar8;
  unsigned_short *puVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  unsigned_short *puVar14;
  double dVar15;
  double dVar16;
  uint uVar17;
  uint uVar18;
  double end;
  unsigned_short *puVar19;
  int iVar22;
  double dVar20;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar27;
  undefined1 auVar26 [16];
  unsigned_short leng;
  unsigned_short *local_2c0;
  double local_2b8;
  ulong local_2b0;
  uchar *local_2a8;
  double local_2a0;
  double local_298;
  unsigned_short dist;
  long local_288;
  unsigned_short **local_280;
  ZopfliBlockState *local_278;
  ulong *local_270;
  float *local_268;
  unsigned_short *local_260;
  float *local_258;
  unsigned_short *local_250;
  double local_248;
  double local_240;
  unsigned_short sublen [259];
  
  uVar17 = 3;
  puVar19 = (unsigned_short *)0x46293e5939a08cea;
  local_2b8 = (double)inend;
  local_2a8 = in;
  local_298 = (double)instart;
  local_280 = path;
  local_278 = s;
  local_270 = pathsize;
  uVar18 = 0;
  do {
    local_2c0 = puVar19;
    puVar19 = (unsigned_short *)(*costmodel)(uVar17,1,costcontext);
    uVar3 = uVar17;
    if ((double)local_2c0 <= (double)puVar19) {
      puVar19 = local_2c0;
      uVar3 = uVar18;
    }
    uVar17 = uVar17 + 1;
    uVar18 = uVar3;
  } while (uVar17 != 0x103);
  lVar12 = 0;
  puVar19 = (unsigned_short *)0x46293e5939a08cea;
  uVar18 = 0;
  do {
    uVar17 = *(uint *)((long)&GetCostModelMinCost_dsymbols + lVar12);
    local_2c0 = puVar19;
    puVar19 = (unsigned_short *)(*costmodel)(3,uVar17,costcontext);
    if ((double)local_2c0 <= (double)puVar19) {
      puVar19 = local_2c0;
      uVar17 = uVar18;
    }
    uVar18 = uVar17;
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x78);
  local_248 = (*costmodel)(uVar3,uVar18,costcontext);
  dVar15 = local_298;
  dVar20 = local_2b8;
  local_288 = (long)local_2b8 - (long)local_298;
  if (local_288 != 0) {
    dVar13 = 0.0;
    if (0x7fff < (ulong)local_298) {
      dVar13 = (double)((long)local_298 - 0x8000);
    }
    ZopfliResetHash(0x8000,h);
    puVar5 = local_2a8;
    ZopfliWarmupHash(local_2a8,(size_t)dVar13,(size_t)dVar20,h);
    if ((ulong)dVar13 < (ulong)dVar15) {
      dVar13 = 1.6189543082926e-319;
      if ((ulong)dVar15 < 0x8000) {
        dVar13 = dVar15;
      }
      lVar12 = -(long)dVar13;
      do {
        ZopfliUpdateHash(puVar5,lVar12 + (long)dVar15,(size_t)dVar20,h);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0);
    }
    auVar4 = _DAT_001293b0;
    auVar24 = _DAT_001293a0;
    auVar23 = _DAT_00129390;
    uVar10 = local_288 - 1;
    if (uVar10 < 0xfffffffffffffffe) {
      auVar21._8_4_ = (int)uVar10;
      auVar21._0_8_ = uVar10;
      auVar21._12_4_ = (int)(uVar10 >> 0x20);
      uVar10 = 0;
      auVar21 = auVar21 ^ _DAT_001293b0;
      do {
        auVar25._8_4_ = (int)uVar10;
        auVar25._0_8_ = uVar10;
        auVar25._12_4_ = (int)(uVar10 >> 0x20);
        auVar26 = (auVar25 | auVar24) ^ auVar4;
        iVar22 = auVar21._4_4_;
        if ((bool)(~(auVar26._4_4_ == iVar22 && auVar21._0_4_ < auVar26._0_4_ ||
                    iVar22 < auVar26._4_4_) & 1)) {
          costs[uVar10 + 1] = 1e+30;
        }
        if ((auVar26._12_4_ != auVar21._12_4_ || auVar26._8_4_ <= auVar21._8_4_) &&
            auVar26._12_4_ <= auVar21._12_4_) {
          costs[uVar10 + 2] = 1e+30;
        }
        auVar25 = (auVar25 | auVar23) ^ auVar4;
        iVar27 = auVar25._4_4_;
        if (iVar27 <= iVar22 && (iVar27 != iVar22 || auVar25._0_4_ <= auVar21._0_4_)) {
          costs[uVar10 + 3] = 1e+30;
          costs[uVar10 + 4] = 1e+30;
        }
        uVar10 = uVar10 + 4;
      } while ((local_288 + 3U & 0xfffffffffffffffc) != uVar10);
    }
    *costs = 0.0;
    *length_array = 0;
    if ((ulong)dVar15 < (ulong)dVar20) {
      local_240 = (double)((long)dVar15 + 0x103);
      local_260 = length_array + (0x102 - (long)dVar15);
      local_268 = costs + -(long)dVar15;
      local_250 = length_array + 3;
      local_258 = costs + 3;
      local_2c0 = (unsigned_short *)dVar15;
      do {
        puVar5 = local_2a8;
        local_2b0 = (long)local_2c0 - (long)dVar15;
        ZopfliUpdateHash(local_2a8,(size_t)local_2c0,(size_t)dVar20,h);
        puVar19 = local_2c0;
        if (((long)local_2c0 + 0x205U < (ulong)dVar20) && ((ulong)local_240 < local_2c0)) {
          if ((0x204 < h->same[(uint)local_2c0 & 0x7fff]) &&
             (0x102 < h->same[(uint)local_2c0 + 0x7efe & 0x7fff])) {
            local_2a0 = (*costmodel)(0x102,1,costcontext);
            puVar14 = local_260;
            pfVar8 = local_268;
            lVar12 = 0;
            puVar9 = puVar19;
            do {
              pfVar8[(long)puVar19 + lVar12 + 0x102] =
                   (float)((double)pfVar8[(long)puVar19 + lVar12] + local_2a0);
              puVar14[(long)puVar19 + lVar12] = 0x102;
              ZopfliUpdateHash(puVar5,lVar12 + 1 + (long)puVar9,(size_t)dVar20,h);
              lVar12 = lVar12 + 1;
              puVar9 = local_2c0;
            } while (lVar12 != 0x102);
            local_2b0 = local_2b0 + 0x102;
            puVar19 = (unsigned_short *)((long)local_2c0 + 0x102);
          }
        }
        ZopfliFindLongestMatch
                  (local_278,h,puVar5,(size_t)puVar19,(size_t)dVar20,0x102,sublen,&dist,&leng);
        local_2c0 = (unsigned_short *)((long)puVar19 + 1);
        if ((ulong)dVar20 < local_2c0) {
          auVar23._0_8_ = (double)costs[local_2b0];
          auVar23._8_8_ = 0;
        }
        else {
          dVar15 = (*costmodel)((uint)puVar5[(long)puVar19],0,costcontext);
          auVar23._0_8_ = (double)costs[local_2b0];
          auVar23._8_8_ = 0;
          if (dVar15 + auVar23._0_8_ < (double)costs[local_2b0 + 1]) {
            costs[local_2b0 + 1] = (float)(dVar15 + auVar23._0_8_);
            length_array[local_2b0 + 1] = 1;
          }
        }
        puVar14 = local_250;
        pfVar8 = local_258;
        uVar10 = local_2b0;
        uVar11 = (long)dVar20 - (long)puVar19;
        if ((ulong)leng < (ulong)((long)dVar20 - (long)puVar19)) {
          uVar11 = (ulong)leng;
        }
        if (2 < uVar11) {
          auVar24._8_8_ = auVar23._8_8_;
          auVar24._0_8_ = auVar23._0_8_ + local_248;
          lVar12 = 0;
          local_2a0 = auVar24._0_8_;
          do {
            if (auVar24._0_8_ < (double)pfVar8[uVar10 + lVar12]) {
              dVar20 = (*costmodel)((int)lVar12 + 3,(uint)sublen[lVar12 + 3],costcontext);
              auVar24._8_8_ = 0;
              auVar24._0_8_ = local_2a0;
              if ((double)costs[local_2b0] + dVar20 < (double)pfVar8[uVar10 + lVar12]) {
                pfVar8[uVar10 + lVar12] = (float)((double)costs[local_2b0] + dVar20);
                puVar14[uVar10 + lVar12] = (short)lVar12 + 3;
              }
            }
            lVar12 = lVar12 + 1;
          } while (uVar11 - 2 != lVar12);
        }
        dVar15 = local_298;
        dVar20 = local_2b8;
      } while (local_2c0 < (ulong)local_2b8);
    }
  }
  ppuVar6 = local_280;
  free(*local_280);
  puVar7 = local_270;
  uVar10 = 0;
  *ppuVar6 = (unsigned_short *)0x0;
  *local_270 = 0;
  dVar13 = extraout_XMM0_Qa;
  if (local_288 == 0) {
    puVar19 = (unsigned_short *)0x0;
  }
  else {
    puVar19 = (unsigned_short *)0x0;
    uVar10 = 0;
    lVar12 = local_288;
    do {
      uVar11 = uVar10;
      if ((uVar10 & uVar10 - 1) == 0) {
        if (uVar10 == 0) {
          puVar19 = (unsigned_short *)malloc(2);
          uVar11 = 0;
          dVar13 = extraout_XMM0_Qa_01;
        }
        else {
          puVar19 = (unsigned_short *)realloc(puVar19,uVar10 << 2);
          uVar11 = *puVar7;
          dVar13 = extraout_XMM0_Qa_00;
        }
        *local_280 = puVar19;
      }
      uVar1 = length_array[lVar12];
      puVar19[uVar11] = uVar1;
      uVar10 = uVar11 + 1;
      *puVar7 = uVar10;
      lVar12 = lVar12 - (ulong)uVar1;
    } while (lVar12 != 0);
    if (1 < uVar10) {
      puVar14 = puVar19 + uVar11;
      uVar11 = 0;
      do {
        uVar2 = puVar19[uVar11];
        puVar19[uVar11] = *puVar14;
        *puVar14 = uVar2;
        uVar11 = uVar11 + 1;
        puVar14 = puVar14 + -1;
      } while (uVar10 >> 1 != uVar11);
    }
  }
  puVar5 = local_2a8;
  if (dVar20 != dVar15) {
    dVar20 = 0.0;
    if (0x7fff < (ulong)dVar15) {
      dVar20 = (double)((long)dVar15 - 0x8000);
    }
    local_2c0 = puVar19;
    ZopfliResetHash(0x8000,h);
    ZopfliWarmupHash(puVar5,(size_t)dVar20,(size_t)local_2b8,h);
    end = local_2b8;
    dVar13 = extraout_XMM0_Qa_02;
    if ((ulong)dVar20 < (ulong)dVar15) {
      dVar20 = 1.6189543082926e-319;
      if ((ulong)dVar15 < 0x8000) {
        dVar20 = dVar15;
      }
      lVar12 = -(long)dVar20;
      do {
        ZopfliUpdateHash(puVar5,lVar12 + (long)dVar15,(size_t)end,h);
        lVar12 = lVar12 + 1;
        dVar13 = extraout_XMM0_Qa_03;
      } while (lVar12 != 0);
    }
    if (uVar10 != 0) {
      uVar11 = 0;
      do {
        uVar1 = local_2c0[uVar11];
        dVar20 = (double)(ulong)uVar1;
        ZopfliUpdateHash(puVar5,(size_t)dVar15,(size_t)end,h);
        end = local_2b8;
        if ((ulong)dVar20 < 3) {
          ZopfliStoreLitLenDist((ushort)puVar5[(long)dVar15],0,(size_t)dVar15,store);
          dVar20 = 4.94065645841247e-324;
          dVar16 = dVar15;
          end = local_2b8;
          dVar13 = extraout_XMM0_Qa_05;
        }
        else {
          local_2b0 = uVar11;
          ZopfliFindLongestMatch
                    (local_278,h,puVar5,(size_t)dVar15,(size_t)local_2b8,(size_t)dVar20,
                     (unsigned_short *)0x0,&leng,sublen);
          ZopfliVerifyLenDist(puVar5,(size_t)end,(size_t)dVar15,leng,uVar1);
          ZopfliStoreLitLenDist(uVar1,leng,(size_t)dVar15,store);
          lVar12 = (long)dVar20 - 1;
          local_2a0 = dVar20;
          local_298 = dVar15;
          do {
            dVar15 = (double)((long)dVar15 + 1);
            ZopfliUpdateHash(puVar5,(size_t)dVar15,(size_t)end,h);
            lVar12 = lVar12 + -1;
            dVar20 = local_2a0;
            uVar11 = local_2b0;
            dVar16 = local_298;
            dVar13 = extraout_XMM0_Qa_04;
          } while (lVar12 != 0);
        }
        dVar15 = (double)((long)dVar16 + (long)dVar20);
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar10);
    }
  }
  return dVar13;
}

Assistant:

static double LZ77OptimalRun(ZopfliBlockState* s,
    const unsigned char* in, size_t instart, size_t inend,
    unsigned short** path, size_t* pathsize,
    unsigned short* length_array, CostModelFun* costmodel,
    void* costcontext, ZopfliLZ77Store* store,
    ZopfliHash* h, float* costs) {
  double cost = GetBestLengths(s, in, instart, inend, costmodel,
                costcontext, length_array, h, costs);
  free(*path);
  *path = 0;
  *pathsize = 0;
  TraceBackwards(inend - instart, length_array, path, pathsize);
  FollowPath(s, in, instart, inend, *path, *pathsize, store, h);
  assert(cost < ZOPFLI_LARGE_FLOAT);
  return cost;
}